

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_base_tableref.cpp
# Opt level: O1

QualifiedName * __thiscall
duckdb::Transformer::TransformQualifiedName
          (QualifiedName *__return_storage_ptr__,Transformer *this,PGRangeVar *root)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->catalog)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->catalog).field_2;
  (__return_storage_ptr__->catalog)._M_string_length = 0;
  (__return_storage_ptr__->catalog).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->schema)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->schema).field_2;
  (__return_storage_ptr__->schema)._M_string_length = 0;
  (__return_storage_ptr__->schema).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  pcVar2 = root->catalogname;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = anon_var_dwarf_4f001a4 + 9;
  }
  else {
    strlen(pcVar2);
  }
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar2);
  pcVar2 = root->schemaname;
  pcVar1 = (char *)(__return_storage_ptr__->schema)._M_string_length;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = anon_var_dwarf_4f001a4 + 9;
  }
  else {
    strlen(pcVar2);
  }
  ::std::__cxx11::string::_M_replace((ulong)&__return_storage_ptr__->schema,0,pcVar1,(ulong)pcVar2);
  pcVar2 = root->relname;
  if (pcVar2 == (char *)0x0) {
    local_40 = 0;
    local_38[0] = 0;
    local_48 = local_38;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_48);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
  }
  else {
    pcVar1 = (char *)(__return_storage_ptr__->name)._M_string_length;
    strlen(pcVar2);
    ::std::__cxx11::string::_M_replace((ulong)&__return_storage_ptr__->name,0,pcVar1,(ulong)pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

QualifiedName Transformer::TransformQualifiedName(duckdb_libpgquery::PGRangeVar &root) {
	QualifiedName qname;
	if (root.catalogname) {
		qname.catalog = root.catalogname;
	} else {
		qname.catalog = INVALID_CATALOG;
	}
	if (root.schemaname) {
		qname.schema = root.schemaname;
	} else {
		qname.schema = INVALID_SCHEMA;
	}
	if (root.relname) {
		qname.name = root.relname;
	} else {
		qname.name = string();
	}
	return qname;
}